

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O3

void soplex::
     SPxQuicksort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
               (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *keys,int end,IdxCompare *compare,int start,bool type)

{
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  int32_t iVar20;
  fpclass_type fVar21;
  int32_t iVar22;
  bool bVar23;
  long lVar24;
  long lVar25;
  uint uVar26;
  int iVar27;
  int start_00;
  ulong uVar28;
  int iVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  uint uVar33;
  int iVar34;
  int *piVar36;
  int iVar37;
  long lVar38;
  ulong uVar35;
  
  uVar28 = (ulong)(uint)start;
  if (start + 1 < end) {
    uVar33 = end - 1;
    uVar35 = (ulong)uVar33;
    uVar26 = uVar33 - start;
    if (0x18 < (int)uVar26) {
LAB_00431aa3:
      start_00 = (int)uVar28;
      iVar27 = (uVar26 >> 1) + start_00;
      pNVar1 = keys + iVar27;
      iVar27 = keys[iVar27].idx;
      iVar34 = (int)uVar35;
      lVar25 = (long)iVar34;
      lVar24 = (long)start_00;
      uVar31 = uVar35;
      uVar30 = uVar28;
      do {
        iVar37 = (int)uVar30;
        iVar29 = (int)uVar31;
        if ((type & 1U) == 0) {
          if (iVar37 < iVar34) {
            piVar36 = &keys[iVar37].idx;
            lVar38 = 0;
            do {
              bVar23 = EQ(*piVar36,iVar27);
              if ((!bVar23) && (iVar27 <= *piVar36)) {
                uVar30 = (ulong)(uint)(iVar37 - (int)lVar38);
                break;
              }
              lVar38 = lVar38 + -1;
              piVar36 = piVar36 + 0x15;
              uVar30 = uVar35;
            } while ((long)iVar37 + -lVar25 != lVar38);
          }
          if (start_00 < iVar29) {
            uVar26 = (uint)uVar30;
            uVar30 = (ulong)iVar29;
            piVar36 = &keys[uVar30].idx;
            do {
              bVar23 = EQ(*piVar36,iVar27);
              uVar31 = uVar30;
              if ((bVar23) || (*piVar36 < iVar27)) break;
              uVar30 = uVar30 - 1;
              piVar36 = piVar36 + -0x15;
              uVar31 = uVar28;
            } while (lVar24 < (long)uVar30);
LAB_00431c4d:
            uVar30 = (ulong)uVar26;
          }
        }
        else {
          if (iVar37 < iVar34) {
            piVar36 = &keys[iVar37].idx;
            lVar38 = 0;
            do {
              bVar23 = EQ(*piVar36,iVar27);
              if ((bVar23) || (iVar27 <= *piVar36)) {
                uVar30 = (ulong)(uint)(iVar37 - (int)lVar38);
                break;
              }
              lVar38 = lVar38 + -1;
              piVar36 = piVar36 + 0x15;
              uVar30 = uVar35;
            } while ((long)iVar37 + -lVar25 != lVar38);
          }
          uVar26 = (uint)uVar30;
          if (start_00 < iVar29) {
            uVar30 = (ulong)iVar29;
            piVar36 = &keys[uVar30].idx;
            do {
              bVar23 = EQ(*piVar36,iVar27);
              if ((!bVar23) && (uVar31 = uVar30, *piVar36 < iVar27)) break;
              uVar30 = uVar30 - 1;
              piVar36 = piVar36 + -0x15;
              uVar31 = uVar28;
            } while (lVar24 < (long)uVar30);
            goto LAB_00431c4d;
          }
        }
        iVar37 = (int)uVar30;
        iVar29 = (int)uVar31;
        if (iVar29 <= iVar37) goto LAB_00431d4e;
        uVar5 = *(undefined8 *)keys[iVar37].val.m_backend.data._M_elems;
        uVar6 = *(undefined8 *)(keys[iVar37].val.m_backend.data._M_elems + 2);
        puVar2 = keys[iVar37].val.m_backend.data._M_elems + 4;
        uVar7 = *(undefined8 *)puVar2;
        uVar8 = *(undefined8 *)(puVar2 + 2);
        puVar2 = keys[iVar37].val.m_backend.data._M_elems + 8;
        uVar9 = *(undefined8 *)puVar2;
        uVar10 = *(undefined8 *)(puVar2 + 2);
        puVar2 = keys[iVar37].val.m_backend.data._M_elems + 0xc;
        uVar11 = *(undefined8 *)puVar2;
        uVar12 = *(undefined8 *)(puVar2 + 2);
        iVar3 = keys[iVar37].val.m_backend.exp;
        bVar23 = keys[iVar37].val.m_backend.neg;
        iVar4 = keys[iVar37].idx;
        uVar13 = *(undefined8 *)(keys[iVar29].val.m_backend.data._M_elems + 2);
        puVar2 = keys[iVar29].val.m_backend.data._M_elems + 4;
        uVar14 = *(undefined8 *)puVar2;
        uVar15 = *(undefined8 *)(puVar2 + 2);
        puVar2 = keys[iVar29].val.m_backend.data._M_elems + 8;
        uVar16 = *(undefined8 *)puVar2;
        uVar17 = *(undefined8 *)(puVar2 + 2);
        puVar2 = keys[iVar29].val.m_backend.data._M_elems + 0xc;
        uVar18 = *(undefined8 *)puVar2;
        uVar19 = *(undefined8 *)(puVar2 + 2);
        *(undefined8 *)keys[iVar37].val.m_backend.data._M_elems =
             *(undefined8 *)keys[iVar29].val.m_backend.data._M_elems;
        *(undefined8 *)(keys[iVar37].val.m_backend.data._M_elems + 2) = uVar13;
        puVar2 = keys[iVar37].val.m_backend.data._M_elems + 4;
        *(undefined8 *)puVar2 = uVar14;
        *(undefined8 *)(puVar2 + 2) = uVar15;
        puVar2 = keys[iVar37].val.m_backend.data._M_elems + 8;
        *(undefined8 *)puVar2 = uVar16;
        *(undefined8 *)(puVar2 + 2) = uVar17;
        puVar2 = keys[iVar37].val.m_backend.data._M_elems + 0xc;
        *(undefined8 *)puVar2 = uVar18;
        *(undefined8 *)(puVar2 + 2) = uVar19;
        keys[iVar37].val.m_backend.exp = keys[iVar29].val.m_backend.exp;
        keys[iVar37].val.m_backend.neg = keys[iVar29].val.m_backend.neg;
        keys[iVar37].idx = keys[iVar29].idx;
        puVar2 = keys[iVar29].val.m_backend.data._M_elems + 0xc;
        *(undefined8 *)puVar2 = uVar11;
        *(undefined8 *)(puVar2 + 2) = uVar12;
        puVar2 = keys[iVar29].val.m_backend.data._M_elems + 8;
        *(undefined8 *)puVar2 = uVar9;
        *(undefined8 *)(puVar2 + 2) = uVar10;
        puVar2 = keys[iVar29].val.m_backend.data._M_elems + 4;
        *(undefined8 *)puVar2 = uVar7;
        *(undefined8 *)(puVar2 + 2) = uVar8;
        *(undefined8 *)keys[iVar29].val.m_backend.data._M_elems = uVar5;
        *(undefined8 *)(keys[iVar29].val.m_backend.data._M_elems + 2) = uVar6;
        keys[iVar29].val.m_backend.exp = iVar3;
        keys[iVar29].val.m_backend.neg = bVar23;
        fVar21 = keys[iVar37].val.m_backend.fpclass;
        iVar22 = keys[iVar37].val.m_backend.prec_elem;
        iVar20 = keys[iVar29].val.m_backend.prec_elem;
        keys[iVar37].val.m_backend.fpclass = keys[iVar29].val.m_backend.fpclass;
        keys[iVar37].val.m_backend.prec_elem = iVar20;
        keys[iVar29].val.m_backend.fpclass = fVar21;
        keys[iVar29].val.m_backend.prec_elem = iVar22;
        keys[iVar29].idx = iVar4;
        uVar30 = (ulong)(iVar37 + 1);
        uVar31 = (ulong)(iVar29 - 1);
      } while( true );
    }
LAB_0043203f:
    if (0 < (int)uVar26) {
      SPxShellsort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
                (keys,uVar33,compare,start);
      return;
    }
  }
  return;
LAB_00431d4e:
  if ((type & 1U) == 0) {
    if (start_00 < iVar29) {
      uVar32 = (ulong)iVar29;
      piVar36 = &keys[uVar32].idx;
      do {
        bVar23 = EQ(iVar27,*piVar36);
        if ((!bVar23) && (uVar31 = uVar32, *piVar36 <= iVar27)) break;
        uVar32 = uVar32 - 1;
        piVar36 = piVar36 + -0x15;
        uVar31 = uVar28;
      } while (lVar24 < (long)uVar32);
    }
    if ((int)uVar31 == iVar34) {
      uVar5 = *(undefined8 *)keys[lVar25].val.m_backend.data._M_elems;
      uVar6 = *(undefined8 *)(keys[lVar25].val.m_backend.data._M_elems + 2);
      puVar2 = keys[lVar25].val.m_backend.data._M_elems + 4;
      uVar7 = *(undefined8 *)puVar2;
      uVar8 = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[lVar25].val.m_backend.data._M_elems + 8;
      uVar9 = *(undefined8 *)puVar2;
      uVar10 = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[lVar25].val.m_backend.data._M_elems + 0xc;
      uVar11 = *(undefined8 *)puVar2;
      uVar12 = *(undefined8 *)(puVar2 + 2);
      iVar27 = keys[lVar25].val.m_backend.exp;
      bVar23 = keys[lVar25].val.m_backend.neg;
      iVar29 = keys[lVar25].idx;
      uVar13 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 2);
      uVar14 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 4);
      uVar15 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 6);
      uVar16 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 8);
      uVar17 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 10);
      uVar18 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 0xc);
      uVar19 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 0xe);
      *(undefined8 *)keys[lVar25].val.m_backend.data._M_elems =
           *(undefined8 *)(pNVar1->val).m_backend.data._M_elems;
      *(undefined8 *)(keys[lVar25].val.m_backend.data._M_elems + 2) = uVar13;
      puVar2 = keys[lVar25].val.m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = uVar14;
      *(undefined8 *)(puVar2 + 2) = uVar15;
      puVar2 = keys[lVar25].val.m_backend.data._M_elems + 8;
      *(undefined8 *)puVar2 = uVar16;
      *(undefined8 *)(puVar2 + 2) = uVar17;
      puVar2 = keys[lVar25].val.m_backend.data._M_elems + 0xc;
      *(undefined8 *)puVar2 = uVar18;
      *(undefined8 *)(puVar2 + 2) = uVar19;
      keys[lVar25].val.m_backend.exp = (pNVar1->val).m_backend.exp;
      keys[lVar25].val.m_backend.neg = (pNVar1->val).m_backend.neg;
      keys[lVar25].idx = pNVar1->idx;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 0xc) = uVar11;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 0xe) = uVar12;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 8) = uVar9;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 10) = uVar10;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 4) = uVar7;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 6) = uVar8;
      *(undefined8 *)(pNVar1->val).m_backend.data._M_elems = uVar5;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 2) = uVar6;
      (pNVar1->val).m_backend.exp = iVar27;
      (pNVar1->val).m_backend.neg = bVar23;
      fVar21 = keys[lVar25].val.m_backend.fpclass;
      iVar22 = keys[lVar25].val.m_backend.prec_elem;
      iVar20 = (pNVar1->val).m_backend.prec_elem;
      keys[lVar25].val.m_backend.fpclass = (pNVar1->val).m_backend.fpclass;
      keys[lVar25].val.m_backend.prec_elem = iVar20;
      (pNVar1->val).m_backend.fpclass = fVar21;
      (pNVar1->val).m_backend.prec_elem = iVar22;
      pNVar1->idx = iVar29;
      uVar31 = (ulong)(iVar34 - 1);
    }
  }
  else {
    if (iVar37 < iVar34) {
      piVar36 = &keys[iVar37].idx;
      lVar38 = 0;
      do {
        bVar23 = EQ(iVar27,*piVar36);
        if ((!bVar23) && (iVar27 < *piVar36)) {
          uVar30 = (ulong)(uint)(iVar37 - (int)lVar38);
          break;
        }
        lVar38 = lVar38 + -1;
        piVar36 = piVar36 + 0x15;
        uVar30 = uVar35;
      } while (iVar37 - lVar25 != lVar38);
    }
    if ((int)uVar30 == start_00) {
      uVar5 = *(undefined8 *)keys[lVar24].val.m_backend.data._M_elems;
      uVar6 = *(undefined8 *)(keys[lVar24].val.m_backend.data._M_elems + 2);
      puVar2 = keys[lVar24].val.m_backend.data._M_elems + 4;
      uVar7 = *(undefined8 *)puVar2;
      uVar8 = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[lVar24].val.m_backend.data._M_elems + 8;
      uVar9 = *(undefined8 *)puVar2;
      uVar10 = *(undefined8 *)(puVar2 + 2);
      puVar2 = keys[lVar24].val.m_backend.data._M_elems + 0xc;
      uVar11 = *(undefined8 *)puVar2;
      uVar12 = *(undefined8 *)(puVar2 + 2);
      iVar27 = keys[lVar24].val.m_backend.exp;
      bVar23 = keys[lVar24].val.m_backend.neg;
      iVar29 = keys[lVar24].idx;
      uVar13 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 2);
      uVar14 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 4);
      uVar15 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 6);
      uVar16 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 8);
      uVar17 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 10);
      uVar18 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 0xc);
      uVar19 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 0xe);
      *(undefined8 *)keys[lVar24].val.m_backend.data._M_elems =
           *(undefined8 *)(pNVar1->val).m_backend.data._M_elems;
      *(undefined8 *)(keys[lVar24].val.m_backend.data._M_elems + 2) = uVar13;
      puVar2 = keys[lVar24].val.m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = uVar14;
      *(undefined8 *)(puVar2 + 2) = uVar15;
      puVar2 = keys[lVar24].val.m_backend.data._M_elems + 8;
      *(undefined8 *)puVar2 = uVar16;
      *(undefined8 *)(puVar2 + 2) = uVar17;
      puVar2 = keys[lVar24].val.m_backend.data._M_elems + 0xc;
      *(undefined8 *)puVar2 = uVar18;
      *(undefined8 *)(puVar2 + 2) = uVar19;
      keys[lVar24].val.m_backend.exp = (pNVar1->val).m_backend.exp;
      keys[lVar24].val.m_backend.neg = (pNVar1->val).m_backend.neg;
      keys[lVar24].idx = pNVar1->idx;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 0xc) = uVar11;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 0xe) = uVar12;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 8) = uVar9;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 10) = uVar10;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 4) = uVar7;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 6) = uVar8;
      *(undefined8 *)(pNVar1->val).m_backend.data._M_elems = uVar5;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 2) = uVar6;
      (pNVar1->val).m_backend.exp = iVar27;
      (pNVar1->val).m_backend.neg = bVar23;
      fVar21 = keys[lVar24].val.m_backend.fpclass;
      iVar22 = keys[lVar24].val.m_backend.prec_elem;
      iVar20 = (pNVar1->val).m_backend.prec_elem;
      keys[lVar24].val.m_backend.fpclass = (pNVar1->val).m_backend.fpclass;
      keys[lVar24].val.m_backend.prec_elem = iVar20;
      (pNVar1->val).m_backend.fpclass = fVar21;
      (pNVar1->val).m_backend.prec_elem = iVar22;
      pNVar1->idx = iVar29;
      uVar30 = (ulong)(start_00 + 1);
    }
  }
  iVar27 = (int)uVar31;
  uVar26 = iVar27 - start_00;
  iVar29 = (int)uVar30;
  uVar33 = iVar34 - iVar29;
  if ((int)uVar33 < (int)uVar26) {
    uVar35 = uVar31 & 0xffffffff;
    uVar30 = uVar28;
    uVar33 = uVar26;
    iVar27 = iVar34;
    start_00 = iVar29;
    if (iVar34 <= iVar29) goto LAB_0043202a;
  }
  else {
    uVar28 = uVar30;
    uVar26 = uVar33;
    if (iVar27 <= start_00) goto LAB_0043202a;
  }
  SPxQuicksort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
            (keys,iVar27 + 1,compare,start_00,(bool)(~type & 1));
  uVar28 = uVar30;
  uVar26 = uVar33;
LAB_0043202a:
  uVar33 = (uint)uVar35;
  start = (int)uVar28;
  type = (bool)(type ^ 1);
  if ((int)uVar26 < 0x19) goto LAB_0043203f;
  goto LAB_00431aa3;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}